

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O1

void __thiscall DatasetBuilder::save(DatasetBuilder *this,path *db_base,string *fname)

{
  IndexBuilder *pIVar1;
  long lVar2;
  pointer pbVar3;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache;
  long *plVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  string *filename;
  pointer pbVar8;
  pointer puVar9;
  string fname_list;
  string ndx_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  taints;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  ofstream of;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  path local_308;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  pointer local_2a0;
  DatasetBuilder *local_288;
  pointer local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268;
  uint7 uStack_267;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar9 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_280 = (this->indices).
              super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_288 = this;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar9 != local_280) {
    do {
      get_index_type_name_abi_cxx11_
                ((string *)local_2c8,
                 ((puVar9->_M_t).
                  super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
                  super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
                  super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl)->ntype);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_2c8);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_220[0]._8_8_ = plVar4[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar4;
      }
      local_228 = plVar4[1];
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_230,(ulong)(fname->_M_dataplus)._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_308._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_308._M_pathname.field_2._8_8_ = plVar4[3];
        local_308._M_pathname._M_dataplus._M_p = (pointer)&local_308._M_pathname.field_2;
      }
      else {
        local_308._M_pathname.field_2._M_allocated_capacity = *psVar7;
        local_308._M_pathname._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_308._M_pathname._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._0_8_ != &local_2b8) {
        operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
      }
      pIVar1 = (puVar9->_M_t).
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      std::experimental::filesystem::v1::__cxx11::path::
      path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                ((path *)local_2c8,&local_308._M_pathname);
      std::experimental::filesystem::v1::__cxx11::path::path((path *)local_230,db_base);
      std::experimental::filesystem::v1::__cxx11::path::_M_append
                ((path *)local_230,(string_type *)local_2c8);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,local_230,(char *)((long)local_230 + local_228));
      (*pIVar1->_vptr_IndexBuilder[3])(pIVar1,&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_230);
      std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_2c8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_260,&local_308._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_pathname._M_dataplus._M_p != &local_308._M_pathname.field_2) {
        operator_delete(local_308._M_pathname._M_dataplus._M_p,
                        local_308._M_pathname.field_2._M_allocated_capacity + 1);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_280);
  }
  std::operator+(&local_328,"files.",fname);
  std::ofstream::ofstream(local_230);
  lVar2 = *(long *)((long)local_230 + -0x18);
  *(undefined4 *)((long)local_220 + lVar2 + 0xc) = 1;
  std::ios::clear((int)(&stack0xfffffffffffffca8 + lVar2) + 0x128);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_308,&local_328)
  ;
  std::experimental::filesystem::v1::__cxx11::path::path((path *)local_2c8,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)local_2c8,&local_308._M_pathname);
  std::ofstream::open(local_230,local_2c8._0_4_);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_2c8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_308);
  pbVar8 = (local_288->fids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (local_288->fids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar3) {
    do {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar3);
  }
  std::ostream::flush();
  local_2b8._8_8_ = local_2c8 + 8;
  local_2c8._8_4_ = _S_red;
  local_2b8._M_allocated_capacity = 0;
  local_2a0 = (pointer)0x0;
  local_268 = 0;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = (char *)uStack_270;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_278;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
       (ulong)uStack_267 << 8;
  local_2a8 = (pointer)local_2b8._8_8_;
  store_dataset(db_base,fname,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_260,&local_328,fname_cache,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_260);
  return;
}

Assistant:

void DatasetBuilder::save(const fs::path &db_base, const std::string &fname) {
    std::set<std::string> index_names;

    for (auto &ndx : indices) {
        std::string ndx_name =
            get_index_type_name(ndx->index_type()) + "." + fname;
        ndx->save(db_base / ndx_name);
        index_names.emplace(ndx_name);
    }

    std::string fname_list = "files." + fname;

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const std::string &filename : fids) {
        of << filename << "\n";
    }
    of.flush();

    std::set<std::string> taints;
    store_dataset(db_base, fname, index_names, fname_list, std::nullopt,
                  taints);
}